

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  CImg<char> *pCVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *pFVar8;
  CImgArgumentException *this_00;
  CImgIOException *pCVar9;
  ulong uVar10;
  CImg<char> local_b8;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> s_filename;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar5 = "non-";
    if (this->_is_shared != false) {
      pcVar5 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar5,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((*filename != '-') || ((pFVar8 = _stdin, filename[1] != '.' && (filename[1] != '\0')))) {
    pFVar8 = fopen(filename,"rb");
  }
  if (pFVar8 == (FILE *)0x0) {
    pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (pCVar9,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",filename,"rb");
    __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  if (((_stdin != pFVar8) && (_stdout != pFVar8)) && (uVar1 = fclose(pFVar8), uVar1 != 0)) {
    cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar1);
  }
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  sVar3 = strlen(filename);
  CImg<char>::CImg(&local_b8,filename,(int)sVar3 + 1,1,1,1,false);
  pCVar4 = CImg<char>::_system_strescape(&local_b8);
  CImg<char>::CImg(&s_filename,pCVar4);
  if ((local_b8._is_shared == false) && (local_b8._data != (char *)0x0)) {
    operator_delete__(local_b8._data);
  }
  pcVar5 = (char *)operator_new__(0x20);
  builtin_strncpy(pcVar5,"which gm >/dev/null 2>&1",0x19);
  iVar2 = system(pcVar5);
  operator_delete__(pcVar5);
  pcVar5 = command._data;
  if (iVar2 == 0) {
    uVar10 = (ulong)command._width;
    pcVar6 = cimg::graphicsmagick_path((char *)0x0,false);
    snprintf(pcVar5,uVar10,"%s convert \"%s\" pnm:-",pcVar6,s_filename._data);
    pFVar8 = popen(command._data,"r");
    if (pFVar8 != (FILE *)0x0) {
      cimg::exception_mode(0,true);
      _load_pnm(this,(FILE *)pFVar8,(char *)0x0);
      pclose(pFVar8);
      goto LAB_001bbbd7;
    }
  }
  while( true ) {
    pcVar5 = filename_tmp._data;
    uVar10 = (ulong)filename_tmp._width;
    pcVar6 = cimg::temporary_path((char *)0x0,false);
    pcVar7 = cimg::filenamerand();
    snprintf(pcVar5,uVar10,"%s%c%s.pnm",pcVar6,0x2f,pcVar7);
    pFVar8 = fopen(filename_tmp._data,"rb");
    pcVar5 = command._data;
    if (pFVar8 == (FILE *)0x0) break;
    if (((_stdin != pFVar8) && (_stdout != pFVar8)) && (iVar2 = fclose(pFVar8), iVar2 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
    }
  }
  pcVar7 = cimg::graphicsmagick_path((char *)0x0,false);
  pcVar6 = s_filename._data;
  CImg<char>::string(&local_b8,filename_tmp._data,true,false);
  pCVar4 = CImg<char>::_system_strescape(&local_b8);
  snprintf(pcVar5,(ulong)command._width,"%s convert \"%s\" \"%s\"",pcVar7,pcVar6,pCVar4->_data);
  if ((local_b8._is_shared == false) && (local_b8._data != (char *)0x0)) {
    operator_delete__(local_b8._data);
  }
  pcVar5 = command._data;
  cimg::graphicsmagick_path((char *)0x0,false);
  sVar3 = strlen(pcVar5);
  uVar10 = sVar3 & 0xffffffff;
  if (uVar10 != 0) {
    pcVar6 = (char *)operator_new__((ulong)((int)sVar3 + 0x18));
    memcpy(pcVar6,pcVar5,uVar10);
    builtin_strncpy(pcVar6 + uVar10," >/dev/null 2>&1",0x11);
    system(pcVar6);
    operator_delete__(pcVar6);
  }
  pFVar8 = fopen(filename_tmp._data,"rb");
  if (pFVar8 == (FILE *)0x0) {
    pFVar8 = cimg::fopen(filename,"r");
    cimg::fclose(pFVar8);
    pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar5 = "non-";
    if (this->_is_shared != false) {
      pcVar5 = "";
    }
    CImgIOException::CImgIOException
              (pCVar9,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external(): Failed to load file \'%s\' with external command \'gm\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar5,"unsigned char",filename);
    __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  if (((_stdin != pFVar8) && (_stdout != pFVar8)) && (iVar2 = fclose(pFVar8), iVar2 != 0)) {
    cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
  }
  _load_pnm(this,(FILE *)0x0,filename_tmp._data);
  remove(filename_tmp._data);
LAB_001bbbd7:
  if ((s_filename._is_shared == false) && (s_filename._data != (char *)0x0)) {
    operator_delete__(s_filename._data);
  }
  if ((filename_tmp._is_shared == false) && (filename_tmp._data != (char *)0x0)) {
    operator_delete__(filename_tmp._data);
  }
  if ((command._is_shared == false) && (command._data != (char *)0x0)) {
    operator_delete__(command._data);
  }
  return this;
}

Assistant:

CImg<T>& load_graphicsmagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_graphicsmagick_external(): Specified filename is (null).",
                                    cimg_instance);
      cimg::fclose(cimg::fopen(filename,"rb")); // Check if file exists
      CImg<charT> command(1024), filename_tmp(256);
      std::FILE *file = 0;
      const CImg<charT> s_filename = CImg<charT>::string(filename)._system_strescape();
#if cimg_OS==1
      if (!cimg::system("which gm")) {
        cimg_snprintf(command,command._width,"%s convert \"%s\" pnm:-",
                      cimg::graphicsmagick_path(),s_filename.data());
        file = popen(command,"r");
        if (file) {
          const unsigned int omode = cimg::exception_mode();
          cimg::exception_mode(0);
          try { load_pnm(file); } catch (...) {
            pclose(file);
            cimg::exception_mode(omode);
            throw CImgIOException(_cimg_instance
                                  "load_graphicsmagick_external(): Failed to load file '%s' "
                                  "with external command 'gm'.",
                                  cimg_instance,
                                  filename);
          }
          pclose(file);
          return *this;
        }
      }
#endif
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.pnm",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=cimg::std_fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s convert \"%s\" \"%s\"",
                    cimg::graphicsmagick_path(),s_filename.data(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command,cimg::graphicsmagick_path());
      if (!(file=cimg::std_fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_graphicsmagick_external(): Failed to load file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }